

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O0

int CfdSetOptionFundRawTx
              (void *handle,void *fund_handle,int key,int64_t int64_value,double double_value,
              bool bool_value)

{
  string *message;
  long in_RCX;
  CfdException *this;
  int in_EDX;
  long in_RSI;
  byte in_R8B;
  undefined8 in_XMM0_Qa;
  string *in_stack_00000008;
  void *in_stack_00000010;
  CfdException *except;
  exception *std_except;
  CfdCapiFundRawTxData *buffer;
  int result;
  allocator *paVar1;
  allocator local_b1;
  string local_b0 [32];
  CfdSourceLocation local_90;
  long local_78;
  allocator local_69;
  string local_68 [48];
  undefined4 local_38;
  byte local_31;
  undefined8 local_30;
  long local_28;
  int local_1c;
  long local_18;
  
  local_31 = in_R8B & 1;
  local_38 = 0xffffffff;
  local_30 = in_XMM0_Qa;
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"FundRawTxData",&local_69);
  cfd::capi::CheckBuffer(in_stack_00000010,in_stack_00000008);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  local_78 = local_18;
  this = (CfdException *)(ulong)(local_1c - 1);
  switch(this) {
  case (CfdException *)0x0:
    *(byte *)(local_18 + 0x68) = local_31 & 1;
    break;
  case (CfdException *)0x1:
    *(undefined8 *)(local_18 + 0x70) = local_30;
    break;
  case (CfdException *)0x2:
    *(undefined8 *)(local_18 + 0x78) = local_30;
    break;
  case (CfdException *)0x3:
    *(long *)(local_18 + 0x80) = local_28;
    break;
  case (CfdException *)0x4:
    *(int *)(local_18 + 0x88) = (int)local_28;
    break;
  case (CfdException *)0x5:
    if (-1 < local_28) {
      *(int *)(local_18 + 0x8c) = (int)local_28;
    }
    break;
  default:
    local_90.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_transaction.cpp"
                 ,0x2f);
    local_90.filename = local_90.filename + 1;
    local_90.line = 0xc9f;
    local_90.funcname = "CfdSetOptionFundRawTx";
    cfd::core::logger::warn<int&>(&local_90,"illegal key {}.",&local_1c);
    message = (string *)__cxa_allocate_exception(0x30);
    paVar1 = &local_b1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"Failed to parameter. key is illegal.",paVar1);
    cfd::core::CfdException::CfdException(this,(CfdError)((ulong)paVar1 >> 0x20),message);
    __cxa_throw(message,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  return 0;
}

Assistant:

int CfdSetOptionFundRawTx(
    void* handle, void* fund_handle, int key, int64_t int64_value,
    double double_value, bool bool_value) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(fund_handle, kPrefixFundRawTxData);
    CfdCapiFundRawTxData* buffer =
        static_cast<CfdCapiFundRawTxData*>(fund_handle);

    switch (key) {
      case kCfdFundTxIsBlind:
        buffer->is_blind = bool_value;
        break;
      case kCfdFundTxDustFeeRate:
        buffer->dust_fee_rate = double_value;
        break;
      case kCfdFundTxLongTermFeeRate:
        buffer->long_term_fee_rate = double_value;
        break;
      case kCfdFundTxKnapsackMinChange:
        buffer->knapsack_min_change = int64_value;
        break;
      case kCfdFundTxBlindExponent:
        buffer->exponent = static_cast<int>(int64_value);
        break;
      case kCfdFundTxBlindMinimumBits:
        if (int64_value >= 0) {
          buffer->minimum_bits = static_cast<int>(int64_value);
        }
        break;
      default:
        warn(CFD_LOG_SOURCE, "illegal key {}.", key);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. key is illegal.");
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}